

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Untee.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall wasm::Untee::create(Untee *this)

{
  unique_ptr<wasm::Untee,_std::default_delete<wasm::Untee>_> local_20 [2];
  Untee *this_local;
  
  this_local = this;
  std::make_unique<wasm::Untee>();
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::Untee,std::default_delete<wasm::Untee>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,local_20);
  std::unique_ptr<wasm::Untee,_std::default_delete<wasm::Untee>_>::~unique_ptr(local_20);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override { return std::make_unique<Untee>(); }